

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char *pcVar1;
  ulong uVar2;
  const_pointer pcVar3;
  long lVar4;
  size_type sVar5;
  char *pcVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char cVar12;
  long lVar13;
  ulong uVar14;
  
  sVar8 = v.size_;
  pcVar9 = v.data_;
  if (pcVar9 == (char *)0x0 && sVar8 != 0) {
    __assert_fail("v.size() == 0 || v.data() != nssv_nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/src/license_generator/../inja/inja.hpp"
                  ,0x292,
                  "size_type nonstd::sv_lite::basic_string_view<char>::find(basic_string_view<CharT, Traits>, size_type) const [CharT = char, Traits = std::char_traits<char>]"
                 );
  }
  uVar2 = this->size_;
  uVar14 = uVar2 - pos;
  if (uVar2 < pos || uVar14 == 0) {
    return 0xffffffffffffffff;
  }
  pcVar3 = this->data_;
  pcVar10 = pcVar3 + pos;
  pcVar11 = pcVar3 + uVar2;
  if (sVar8 == 0) goto LAB_00188ed3;
  if (0 < (long)uVar14 >> 2) {
    cVar12 = *pcVar9;
    pcVar10 = pcVar3 + pos + (uVar14 & 0xfffffffffffffffc);
    lVar13 = ((long)uVar14 >> 2) + 1;
    pcVar6 = pcVar3 + pos + 1;
    do {
      if (pcVar6[-1] == cVar12) {
        pcVar6 = pcVar6 + -1;
        goto LAB_00188dd0;
      }
      if (*pcVar6 == cVar12) goto LAB_00188dd0;
      if (pcVar6[1] == cVar12) {
        pcVar6 = pcVar6 + 1;
        goto LAB_00188dd0;
      }
      if (pcVar6[2] == cVar12) {
        pcVar6 = pcVar6 + 2;
        goto LAB_00188dd0;
      }
      lVar13 = lVar13 + -1;
      pcVar6 = pcVar6 + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)pcVar11 - (long)pcVar10;
  if (lVar13 == 3) {
    cVar12 = *pcVar9;
    pcVar6 = pcVar10;
    if (*pcVar10 != cVar12) {
      pcVar10 = pcVar10 + 1;
      goto LAB_00188db2;
    }
  }
  else {
    if (lVar13 == 2) {
      cVar12 = *pcVar9;
LAB_00188db2:
      pcVar6 = pcVar10;
      if (*pcVar10 == cVar12) goto LAB_00188dd0;
      pcVar10 = pcVar10 + 1;
    }
    else {
      pcVar6 = pcVar11;
      if (lVar13 != 1) goto LAB_00188dd0;
      cVar12 = *pcVar9;
    }
    pcVar6 = pcVar10;
    if (*pcVar10 != cVar12) {
      pcVar6 = pcVar11;
    }
  }
LAB_00188dd0:
  pcVar10 = pcVar6;
  if ((sVar8 != 1) && (pcVar10 = pcVar11, pcVar6 != pcVar11)) {
    do {
      pcVar1 = pcVar6 + 1;
      pcVar10 = pcVar11;
      if (pcVar1 == pcVar11) break;
      lVar13 = 1;
      while (pcVar6[lVar13] == pcVar9[lVar13]) {
        pcVar10 = pcVar6;
        if (((2 - sVar8) + lVar13 == 1) ||
           (lVar4 = lVar13 + 1, lVar13 = lVar13 + 1, pcVar10 = pcVar11, pcVar6 + lVar4 == pcVar11))
        goto LAB_00188ed3;
      }
      lVar13 = (long)pcVar11 - (long)pcVar1 >> 2;
      pcVar10 = pcVar1;
      if (0 < lVar13) {
        cVar12 = *pcVar9;
        lVar13 = lVar13 + 1;
        pcVar7 = pcVar6;
        do {
          pcVar6 = pcVar7 + 4;
          if (pcVar7[1] == cVar12) {
            pcVar6 = pcVar7 + 1;
            goto LAB_00188ec7;
          }
          if (pcVar7[2] == cVar12) {
            pcVar6 = pcVar7 + 2;
            goto LAB_00188ec7;
          }
          if (pcVar7[3] == cVar12) {
            pcVar6 = pcVar7 + 3;
            goto LAB_00188ec7;
          }
          if (*pcVar6 == cVar12) goto LAB_00188ec7;
          lVar13 = lVar13 + -1;
          pcVar10 = pcVar1 + ((long)pcVar11 - (long)pcVar1 & 0xfffffffffffffffc);
          pcVar7 = pcVar6;
        } while (1 < lVar13);
      }
      pcVar6 = pcVar10;
      lVar13 = (long)pcVar11 - (long)pcVar6;
      if (lVar13 == 3) {
        cVar12 = *pcVar9;
        if (*pcVar6 != cVar12) {
          pcVar6 = pcVar6 + 1;
          goto LAB_00188ea1;
        }
      }
      else {
        if (lVar13 == 2) {
          cVar12 = *pcVar9;
LAB_00188ea1:
          if (*pcVar6 == cVar12) goto LAB_00188ec7;
          pcVar6 = pcVar6 + 1;
        }
        else {
          pcVar10 = pcVar11;
          if (lVar13 != 1) break;
          cVar12 = *pcVar9;
        }
        pcVar10 = pcVar11;
        if (*pcVar6 != cVar12) break;
      }
LAB_00188ec7:
      pcVar10 = pcVar11;
    } while (pcVar6 != pcVar11);
  }
LAB_00188ed3:
  sVar5 = 0xffffffffffffffff;
  if (pcVar11 != pcVar10) {
    sVar5 = (long)pcVar10 - (long)pcVar3;
  }
  return sVar5;
}

Assistant:

nssv_constexpr14 size_type find(basic_string_view v, size_type pos = 0) const nssv_noexcept  // (1)
		{
			return assert(v.size() == 0 || v.data() != nssv_nullptr),
				   pos >= size() ? npos : to_pos(std::search(cbegin() + pos, cend(), v.cbegin(), v.cend(), Traits::eq));
		}